

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# physical_expression_scan.cpp
# Opt level: O3

void __thiscall
duckdb::PhysicalExpressionScan::EvaluateExpression
          (PhysicalExpressionScan *this,ClientContext *context,idx_t expression_idx,
          optional_ptr<duckdb::DataChunk,_true> child_chunk,DataChunk *result,
          optional_ptr<duckdb::DataChunk,_true> temp_chunk_ptr)

{
  Allocator *allocator;
  DataChunk temp_chunk;
  optional_ptr<duckdb::DataChunk,_true> local_78;
  DataChunk local_70;
  
  local_78.ptr = temp_chunk_ptr.ptr;
  if (temp_chunk_ptr.ptr == (DataChunk *)0x0) {
    DataChunk::DataChunk(&local_70);
    allocator = Allocator::Get(context);
    DataChunk::Initialize(&local_70,allocator,&(this->super_PhysicalOperator).types,0x800);
    EvaluateExpressionInternal(this,context,expression_idx,child_chunk,result,&local_70);
    DataChunk::~DataChunk(&local_70);
  }
  else {
    optional_ptr<duckdb::DataChunk,_true>::CheckValid(&local_78);
    EvaluateExpressionInternal(this,context,expression_idx,child_chunk,result,local_78.ptr);
  }
  return;
}

Assistant:

void PhysicalExpressionScan::EvaluateExpression(ClientContext &context, idx_t expression_idx,
                                                optional_ptr<DataChunk> child_chunk, DataChunk &result,
                                                optional_ptr<DataChunk> temp_chunk_ptr) const {
	if (temp_chunk_ptr) {
		EvaluateExpressionInternal(context, expression_idx, child_chunk, result, *temp_chunk_ptr);
	} else {
		DataChunk temp_chunk;
		temp_chunk.Initialize(Allocator::Get(context), GetTypes());
		EvaluateExpressionInternal(context, expression_idx, child_chunk, result, temp_chunk);
	}
}